

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O3

void CollectColorRedTransforms_SSE2
               (uint32_t *argb,int stride,int tile_width,int tile_height,int green_to_red,
               uint32_t *histo)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint tile_width_00;
  ulong uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 local_48 [16];
  uint16_t values [8];
  
  auVar3 = _DAT_001bc940;
  auVar2 = _DAT_001b76d0;
  if (0 < tile_height) {
    iVar5 = ((int)(char)green_to_red & 0x1fffU) * 8;
    auVar9._4_4_ = iVar5;
    auVar9._0_4_ = iVar5;
    auVar9._8_4_ = iVar5;
    auVar9._12_4_ = iVar5;
    uVar4 = 0;
    do {
      if (7 < tile_width) {
        lVar8 = 8;
        lVar6 = 0;
        do {
          auVar11 = *(undefined1 (*) [16])(argb + uVar4 * (long)stride + lVar6);
          auVar1 = *(undefined1 (*) [16])(argb + uVar4 * (long)stride + lVar6 + 4);
          auVar10 = pmulhw(auVar11 & auVar3,auVar9);
          auVar12[0] = auVar11[2] - auVar10[0];
          auVar12[1] = auVar11[3] - auVar10[1];
          auVar12[2] = -auVar10[2];
          auVar12[3] = -auVar10[3];
          auVar12[4] = auVar11[6] - auVar10[4];
          auVar12[5] = auVar11[7] - auVar10[5];
          auVar12[6] = -auVar10[6];
          auVar12[7] = -auVar10[7];
          auVar12[8] = auVar11[10] - auVar10[8];
          auVar12[9] = auVar11[0xb] - auVar10[9];
          auVar12[10] = -auVar10[10];
          auVar12[0xb] = -auVar10[0xb];
          auVar12[0xc] = auVar11[0xe] - auVar10[0xc];
          auVar12[0xd] = auVar11[0xf] - auVar10[0xd];
          auVar12[0xe] = -auVar10[0xe];
          auVar12[0xf] = -auVar10[0xf];
          auVar11 = pmulhw(auVar1 & auVar3,auVar9);
          auVar10[0] = auVar1[2] - auVar11[0];
          auVar10[1] = auVar1[3] - auVar11[1];
          auVar10[2] = -auVar11[2];
          auVar10[3] = -auVar11[3];
          auVar10[4] = auVar1[6] - auVar11[4];
          auVar10[5] = auVar1[7] - auVar11[5];
          auVar10[6] = -auVar11[6];
          auVar10[7] = -auVar11[7];
          auVar10[8] = auVar1[10] - auVar11[8];
          auVar10[9] = auVar1[0xb] - auVar11[9];
          auVar10[10] = -auVar11[10];
          auVar10[0xb] = -auVar11[0xb];
          auVar10[0xc] = auVar1[0xe] - auVar11[0xc];
          auVar10[0xd] = auVar1[0xf] - auVar11[0xd];
          auVar10[0xe] = -auVar11[0xe];
          auVar10[0xf] = -auVar11[0xf];
          local_48 = packssdw(auVar12 & auVar2,auVar10 & auVar2);
          lVar7 = 0;
          do {
            histo[*(ushort *)(local_48 + lVar7 * 2)] = histo[*(ushort *)(local_48 + lVar7 * 2)] + 1;
            lVar7 = lVar7 + 1;
          } while (lVar7 != 8);
          lVar8 = lVar8 + 8;
          lVar6 = lVar6 + 8;
        } while (lVar8 <= tile_width);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != (uint)tile_height);
  }
  tile_width_00 = tile_width & 7;
  if (tile_width_00 != 0) {
    VP8LCollectColorRedTransforms_C
              ((uint32_t *)((long)argb + ((long)tile_width * 4 - (ulong)(tile_width_00 * 4))),stride
               ,tile_width_00,tile_height,green_to_red,histo);
    return;
  }
  return;
}

Assistant:

static void CollectColorRedTransforms_SSE2(const uint32_t* WEBP_RESTRICT argb,
                                           int stride,
                                           int tile_width, int tile_height,
                                           int green_to_red, uint32_t histo[]) {
  const __m128i mults_g = MK_CST_16(0, CST_5b(green_to_red));
  const __m128i mask_g = _mm_set1_epi32(0x00ff00);  // green mask
  const __m128i mask = _mm_set1_epi32(0xff);

  int y;
  for (y = 0; y < tile_height; ++y) {
    const uint32_t* const src = argb + y * stride;
    int i, x;
    for (x = 0; x + SPAN <= tile_width; x += SPAN) {
      uint16_t values[SPAN];
      const __m128i in0 = _mm_loadu_si128((__m128i*)&src[x +        0]);
      const __m128i in1 = _mm_loadu_si128((__m128i*)&src[x + SPAN / 2]);
      const __m128i A0 = _mm_and_si128(in0, mask_g);    // 0 0  | g 0
      const __m128i A1 = _mm_and_si128(in1, mask_g);
      const __m128i B0 = _mm_srli_epi32(in0, 16);       // 0 0  | x r
      const __m128i B1 = _mm_srli_epi32(in1, 16);
      const __m128i C0 = _mm_mulhi_epi16(A0, mults_g);  // 0 0  | x dr
      const __m128i C1 = _mm_mulhi_epi16(A1, mults_g);
      const __m128i E0 = _mm_sub_epi8(B0, C0);          // x x  | x r'
      const __m128i E1 = _mm_sub_epi8(B1, C1);
      const __m128i F0 = _mm_and_si128(E0, mask);       // 0 0  | 0 r'
      const __m128i F1 = _mm_and_si128(E1, mask);
      const __m128i I = _mm_packs_epi32(F0, F1);
      _mm_storeu_si128((__m128i*)values, I);
      for (i = 0; i < SPAN; ++i) ++histo[values[i]];
    }
  }
  {
    const int left_over = tile_width & (SPAN - 1);
    if (left_over > 0) {
      VP8LCollectColorRedTransforms_C(argb + tile_width - left_over, stride,
                                      left_over, tile_height,
                                      green_to_red, histo);
    }
  }
}